

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O2

void print_instructions(vec *instructions,int format_blank_count,_Bool format_is_block)

{
  instruction *inst;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  bool bVar6;
  
  iVar2 = 0;
  if (0 < format_blank_count) {
    iVar2 = format_blank_count;
  }
  iVar1 = format_blank_count + -2;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  for (uVar5 = 0; uVar5 < instructions->size; uVar5 = uVar5 + 1) {
    printf("             ");
    iVar4 = iVar2;
    if ((format_is_block) && (iVar3 = iVar1, instructions->size - 1 == uVar5)) {
      while (iVar3 != 0) {
        putchar(0x20);
        iVar3 = iVar3 + -1;
      }
    }
    else {
      while (bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6) {
        putchar(0x20);
      }
    }
    inst = (instruction *)(*instructions->get_ele)(instructions,uVar5);
    print_instruction(inst,format_blank_count);
  }
  return;
}

Assistant:

void print_instructions(vec *instructions, int format_blank_count, bool format_is_block) {
    for (int i = 0; i < instructions->size; ++i) {
        printf("             ");
        if (format_is_block && i == instructions->size - 1) {
            for (int j = 0; j < format_blank_count - 2; ++j) {
                printf(" ");
            }
        } else {
            for (int j = 0; j < format_blank_count; ++j) {
                printf(" ");
            }
        }
        print_instruction((instruction *) (instructions->get_ele(instructions, i)), format_blank_count);
    }
}